

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void check_create_inter_and_list(Am_Object *window,Am_Object *inter,Am_Value_List *accel_list)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object *this;
  Am_Value value;
  Am_Object AStack_38;
  Am_Value local_30;
  Am_Object local_20;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(window,0x1e2,5);
  Am_Value::operator=(&local_30,pAVar2);
  bVar1 = Am_Value::Valid(&local_30);
  if (bVar1) {
    Am_Object::operator=(inter,&local_30);
  }
  else {
    Am_Object::Create(&AStack_38,(char *)&Am_Accelerator_Inter);
    Am_Object::operator=(inter,&AStack_38);
    Am_Object::~Am_Object(&AStack_38);
    Am_Object::Am_Object(&local_20,inter);
    Am_Object::Add_Part(window,0x1e2,&local_20,0);
    Am_Object::~Am_Object(&local_20);
  }
  pAVar2 = Am_Object::Get(window,0x1e3,5);
  Am_Value::operator=(&local_30,pAVar2);
  bVar1 = Am_Value::Valid(&local_30);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(&local_30);
    if (bVar1) {
      Am_Value_List::operator=(accel_list,&local_30);
      goto LAB_0025f195;
    }
  }
  Am_Object::Create(&AStack_38,(char *)&Am_Command);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_38);
  Am_Value_List::Add(accel_list,pAVar3,Am_TAIL,true);
  Am_Object::~Am_Object(&AStack_38);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(accel_list);
  this = Am_Object::Add(window,0x1e3,pAVar3,0);
  Am_Object::Set_Inherit_Rule(this,0x1e3,Am_LOCAL);
LAB_0025f195:
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

static void
check_create_inter_and_list(Am_Object &window, Am_Object &inter,
                            Am_Value_List &accel_list)
{
  Am_Value value;
  value = window.Peek(Am_ACCELERATOR_INTER, Am_NO_DEPENDENCY);
  if (!value.Valid()) {
    Am_INTER_TRACE_PRINT(window, "Creating accel inter for " << window);
    inter = Am_Accelerator_Inter.Create();
    window.Add_Part(Am_ACCELERATOR_INTER, inter);
  } else
    inter = value;
  value = window.Peek(Am_ACCELERATOR_LIST, Am_NO_DEPENDENCY);
  if (value.Valid() && Am_Value_List::Test(value))
    accel_list = value;
  else {
    accel_list.Add(Am_Command.Create(DSTR("dummy"))); //so will be a real list
    window.Add(Am_ACCELERATOR_LIST, accel_list)
        .Set_Inherit_Rule(Am_ACCELERATOR_LIST, Am_LOCAL);
  }
}